

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O1

size_t __thiscall
webrtc::WavReader::ReadSamples(WavReader *this,size_t num_samples,int16_t *samples)

{
  int iVar1;
  string *result;
  ostream *poVar2;
  size_t *v2;
  size_t read;
  size_t local_190;
  FatalMessage local_188;
  
  if (this->num_samples_remaining_ < num_samples) {
    num_samples = this->num_samples_remaining_;
  }
  local_190 = fread(samples,2,num_samples,(FILE *)this->file_handle_);
  if (local_190 != num_samples) {
    iVar1 = feof((FILE *)this->file_handle_);
    if (iVar1 == 0) {
      rtc::FatalMessage::FatalMessage
                (&local_188,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
                 ,0x58);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_188,"Check failed: read == num_samples || feof(file_handle_)",
                 0x37);
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&local_188);
      std::operator<<(poVar2,"# ");
      rtc::FatalMessage::~FatalMessage(&local_188);
    }
  }
  v2 = &this->num_samples_remaining_;
  if (*v2 < local_190) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (&local_190,v2,"read <= num_samples_remaining_");
  }
  else {
    result = (string *)0x0;
  }
  if (result == (string *)0x0) {
    *v2 = *v2 - local_190;
    return local_190;
  }
  rtc::FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/wav_file.cc"
             ,0x59,result);
  rtc::FatalMessage::~FatalMessage(&local_188);
}

Assistant:

size_t WavReader::ReadSamples(size_t num_samples, int16_t* samples) {
#ifndef WEBRTC_ARCH_LITTLE_ENDIAN
#error "Need to convert samples to big-endian when reading from WAV file"
#endif
  // There could be metadata after the audio; ensure we don't read it.
  num_samples = std::min(num_samples, num_samples_remaining_);
  const size_t read =
      fread(samples, sizeof(*samples), num_samples, file_handle_);
  // If we didn't read what was requested, ensure we've reached the EOF.
  RTC_CHECK(read == num_samples || feof(file_handle_));
  RTC_CHECK_LE(read, num_samples_remaining_);
  num_samples_remaining_ -= read;
  return read;
}